

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::AggressiveDCEPass::AddUnreachable(AggressiveDCEPass *this,BasicBlock **block)

{
  BasicBlock *parent_block;
  Analysis preserved_analyses;
  IRContext *context;
  undefined1 local_38 [8];
  InstructionBuilder builder;
  BasicBlock **block_local;
  AggressiveDCEPass *this_local;
  
  builder._24_8_ = block;
  context = Pass::context((Pass *)this);
  parent_block = *(BasicBlock **)builder._24_8_;
  preserved_analyses = operator|(kAnalysisInstrToBlockMapping,kAnalysisBegin);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)local_38,context,parent_block,preserved_analyses);
  InstructionBuilder::AddUnreachable((InstructionBuilder *)local_38);
  return;
}

Assistant:

void AggressiveDCEPass::AddUnreachable(BasicBlock*& block) {
  InstructionBuilder builder(
      context(), block,
      IRContext::kAnalysisInstrToBlockMapping | IRContext::kAnalysisDefUse);
  builder.AddUnreachable();
}